

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

UCurrRegistryKey CReg::reg(UChar *_iso,char *_id,UErrorCode *status)

{
  CReg *this;
  
  if ((((status != (UErrorCode *)0x0) && (_id != (char *)0x0)) && (_iso != (UChar *)0x0)) &&
     (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    this = (CReg *)icu_63::UMemory::operator_new((UMemory *)0xb0,(size_t)_id);
    if (this == (CReg *)0x0) {
      this = (CReg *)0x0;
    }
    else {
      CReg(this,_iso,_id);
    }
    if (this == (CReg *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      umtx_lock_63(&gCRegLock);
      if (gCRegHead == (CReg *)0x0) {
        ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
      }
      this->next = gCRegHead;
      gCRegHead = this;
      umtx_unlock_63(&gCRegLock);
    }
    if (this != (CReg *)0x0) {
      return this;
    }
  }
  return (UCurrRegistryKey)0x0;
}

Assistant:

static UCurrRegistryKey reg(const UChar* _iso, const char* _id, UErrorCode* status)
    {
        if (status && U_SUCCESS(*status) && _iso && _id) {
            CReg* n = new CReg(_iso, _id);
            if (n) {
                umtx_lock(&gCRegLock);
                if (!gCRegHead) {
                    /* register for the first time */
                    ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
                }
                n->next = gCRegHead;
                gCRegHead = n;
                umtx_unlock(&gCRegLock);
                return n;
            }
            *status = U_MEMORY_ALLOCATION_ERROR;
        }
        return 0;
    }